

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderQuadsDegenerateCase::deinit(TessellationShaderQuadsDegenerateCase *this)

{
  TessellationShaderUtils *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TessellationShaderQuadsDegenerateCase *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  TestCaseBase::deinit(&this->super_TestCaseBase);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(0);
  if (this->m_utils != (TessellationShaderUtils *)0x0) {
    this_00 = this->m_utils;
    if (this_00 != (TessellationShaderUtils *)0x0) {
      TessellationShaderUtils::~TessellationShaderUtils(this_00);
      operator_delete(this_00,0x20);
    }
    this->m_utils = (TessellationShaderUtils *)0x0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderQuadsDegenerateCase::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Call base class' deinit() */
	TestCaseBase::deinit();

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Deinitialize utils instance */
	if (m_utils != DE_NULL)
	{
		delete m_utils;

		m_utils = DE_NULL;
	}

	/* Delete vertex array object */
	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}